

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack8to1_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint _c;
  undefined8 uVar18;
  int *piVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  int iVar24;
  int iVar25;
  char *kptr0;
  ulong uVar26;
  ulong uVar27;
  undefined4 *puVar28;
  undefined4 *puVar29;
  undefined4 *puVar30;
  int q;
  ulong uVar31;
  long lVar32;
  undefined4 *puVar33;
  undefined8 *puVar34;
  undefined8 *puVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  int iVar38;
  bool bVar39;
  undefined1 local_88 [64];
  size_t local_48;
  long local_40;
  void *local_38;
  
  uVar2 = bottom_im2col->w;
  uVar36 = (ulong)(int)uVar2;
  iVar38 = bottom_im2col->h;
  uVar21 = bottom_im2col->c;
  iVar3 = top_blob->c;
  local_48 = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = 0;
  local_88._0_8_ = (undefined1 (*) [16])0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_88._32_8_ = (Allocator *)0x0;
  local_88._40_4_ = 0;
  local_88._44_4_ = 0;
  _c = (uVar2 & 1) + (uVar2 >> 1);
  if ((long)uVar36 < 2) {
    _c = uVar2;
  }
  Mat::create((Mat *)local_88,iVar38 << (1 < (long)uVar36),uVar21,_c,8,8,opt->workspace_allocator);
  uVar20 = 0;
  iVar24 = 0;
  if (0 < iVar38) {
    iVar24 = iVar38;
  }
  uVar27 = 0;
  if (0 < (int)uVar21) {
    uVar27 = (ulong)uVar21;
  }
  uVar26 = (ulong)(uint)((int)uVar2 >> 1);
  if ((int)uVar2 >> 1 < 1) {
    uVar26 = uVar20;
  }
  for (uVar22 = 0; uVar22 != uVar26; uVar22 = uVar22 + 1) {
    puVar34 = (undefined8 *)((undefined1 *)local_88._0_8_ + local_48 * uVar22 * local_88._16_8_);
    for (uVar31 = 0; uVar31 != uVar27; uVar31 = uVar31 + 1) {
      puVar35 = (undefined8 *)
                ((long)bottom_im2col->data +
                bottom_im2col->cstep * bottom_im2col->elemsize * uVar31 + uVar20);
      iVar25 = iVar24;
      while (bVar39 = iVar25 != 0, iVar25 = iVar25 + -1, bVar39) {
        uVar18 = puVar35[1];
        *puVar34 = *puVar35;
        puVar34[1] = uVar18;
        puVar34 = puVar34 + 2;
        puVar35 = puVar35 + uVar36;
      }
    }
    uVar20 = uVar20 + 0x10;
  }
  uVar20 = uVar36 & 0xfffffffffffffffe;
  lVar32 = uVar20 * 8;
  for (; (long)uVar20 < (long)uVar36; uVar20 = uVar20 + 1) {
    uVar26 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
    puVar34 = (undefined8 *)
              ((undefined1 *)local_88._0_8_ +
              (long)((int)((long)uVar26 % 2) + (int)((long)uVar26 / 2)) * local_48 * local_88._16_8_
              );
    pvVar4 = bottom_im2col->data;
    for (uVar26 = 0; uVar26 != uVar27; uVar26 = uVar26 + 1) {
      puVar35 = (undefined8 *)
                ((long)pvVar4 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar32);
      iVar25 = iVar24;
      while (bVar39 = iVar25 != 0, iVar25 = iVar25 + -1, bVar39) {
        *puVar34 = *puVar35;
        puVar34 = puVar34 + 1;
        puVar35 = puVar35 + uVar36;
      }
    }
    lVar32 = lVar32 + 8;
  }
  local_38 = top_blob->data;
  local_40 = top_blob->elemsize * top_blob->cstep;
  uVar27 = 0;
  uVar20 = (ulong)(uVar21 * iVar38);
  if ((int)(uVar21 * iVar38) < 1) {
    uVar20 = uVar27;
  }
  uVar26 = (ulong)(uint)(iVar3 >> 2);
  if (iVar3 >> 2 < 1) {
    uVar26 = uVar27;
  }
  do {
    iVar38 = (int)uVar20;
    if (uVar27 == uVar26) {
      uVar20 = (long)iVar3 & 0xfffffffffffffffc;
      sVar5 = top_blob->elemsize;
      sVar6 = top_blob->cstep;
      pvVar4 = top_blob->data;
      do {
        if ((long)iVar3 <= (long)uVar20) {
          piVar19 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
                free((void *)local_88._0_8_);
              }
              else {
                (*(*(_func_int ***)local_88._32_8_)[3])(0);
              }
            }
          }
          return;
        }
        uVar27 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
        lVar32 = (long)((int)((long)uVar27 % 4) + (int)((long)uVar27 / 4));
        sVar7 = kernel->cstep;
        sVar8 = kernel->elemsize;
        puVar34 = (undefined8 *)(sVar5 * sVar6 * uVar20 + (long)pvVar4);
        pvVar9 = kernel->data;
        for (uVar27 = 0; (long)(uVar27 | 1) < (long)uVar36; uVar27 = uVar27 + 2) {
          if (iVar38 != 0) {
            auVar1 = *(undefined1 (*) [16])
                      ((undefined1 *)local_88._0_8_ + (uVar27 >> 1) * local_88._16_8_ * local_48);
            auVar10 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
            vpunpcklbw_avx(auVar1,auVar10);
            vpunpckhbw_avx(auVar1,auVar10);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)(sVar7 * lVar32 * sVar8 + (long)pvVar9);
            vpmovsxbw_avx(auVar1);
            halt_baddata();
          }
          auVar1 = vpshufd_avx((undefined1  [16])0x0,0xee);
          auVar1 = vpaddd_avx(auVar1,(undefined1  [16])0x0);
          auVar10 = vpshufd_avx((undefined1  [16])0x0,0xee);
          auVar10 = vpaddd_avx(auVar10,(undefined1  [16])0x0);
          auVar1 = vphaddd_avx(auVar1,auVar10);
          auVar1 = vpshufd_avx(auVar1,0xe8);
          *puVar34 = auVar1._0_8_;
          puVar34 = puVar34 + 1;
        }
        sVar7 = kernel->cstep;
        sVar8 = kernel->elemsize;
        pvVar9 = kernel->data;
        while (uVar21 = (uint)uVar27, (int)uVar21 < (int)uVar2) {
          if (iVar38 != 0) {
            auVar10._8_8_ = 0;
            auVar10._0_8_ =
                 *(ulong *)((undefined1 *)local_88._0_8_ +
                           (ulong)((uVar21 & 1) + ((uint)(uVar27 >> 1) & 0x7fffffff)) *
                           local_88._16_8_ * local_48);
            vpmovsxbw_avx(auVar10);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(lVar32 * sVar7 * sVar8 + (long)pvVar9);
            vpmovsxbw_avx(auVar11);
            halt_baddata();
          }
          auVar1 = vphaddd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar1 = vphaddd_avx(auVar1,auVar1);
          *(int *)puVar34 = auVar1._0_4_;
          puVar34 = (undefined8 *)((long)puVar34 + 4);
          uVar27 = (ulong)(uVar21 + 1);
        }
        uVar20 = uVar20 + 1;
      } while( true );
    }
    puVar28 = (undefined4 *)(uVar27 * 4 * local_40 + (long)local_38);
    puVar29 = (undefined4 *)((uVar27 * 4 + 1) * local_40 + (long)local_38);
    puVar30 = (undefined4 *)((uVar27 * 4 + 2) * local_40 + (long)local_38);
    puVar33 = (undefined4 *)((uVar27 * 4 + 3) * local_40 + (long)local_38);
    pauVar37 = (undefined1 (*) [16])(kernel->cstep * kernel->elemsize * uVar27 + (long)kernel->data)
    ;
    pauVar23 = (undefined1 (*) [16])local_88._0_8_;
    for (uVar22 = 0; (long)(uVar22 | 1) < (long)uVar36; uVar22 = uVar22 + 2) {
      if (iVar38 != 0) {
        auVar1 = *pauVar23;
        auVar10 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        vpunpcklbw_avx(auVar1,auVar10);
        vpunpckhbw_avx(auVar1,auVar10);
        auVar1 = *pauVar37;
        auVar10 = pauVar37[1];
        auVar11 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        auVar12 = vpcmpgtb_avx((undefined1  [16])0x0,auVar10);
        vpunpcklbw_avx(auVar1,auVar11);
        vpunpckhbw_avx(auVar1,auVar11);
        vpunpcklbw_avx(auVar10,auVar12);
        vpunpckhbw_avx(auVar10,auVar12);
        halt_baddata();
      }
      auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar14 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar10 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar11 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar15 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar16 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar12 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar13 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar17 = vpunpcklqdq_avx(auVar1,auVar14);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar14);
      auVar1 = vpaddd_avx(auVar17,auVar1);
      auVar14 = vpunpcklqdq_avx(auVar10,auVar11);
      auVar10 = vpunpckhqdq_avx(auVar10,auVar11);
      auVar10 = vpaddd_avx(auVar10,auVar14);
      auVar1 = vpaddd_avx(auVar1,auVar10);
      auVar11 = vpunpcklqdq_avx(auVar15,auVar16);
      auVar10 = vpunpckhqdq_avx(auVar15,auVar16);
      auVar10 = vpaddd_avx(auVar11,auVar10);
      auVar11 = vpunpcklqdq_avx(auVar12,auVar13);
      *puVar28 = auVar1._0_4_;
      *puVar29 = auVar1._4_4_;
      *puVar30 = auVar1._8_4_;
      *puVar33 = auVar1._12_4_;
      auVar1 = vpunpckhqdq_avx(auVar12,auVar13);
      auVar1 = vpaddd_avx(auVar1,auVar11);
      auVar1 = vpaddd_avx(auVar10,auVar1);
      puVar28[1] = auVar1._0_4_;
      puVar29[1] = auVar1._4_4_;
      puVar30[1] = auVar1._8_4_;
      puVar33[1] = auVar1._12_4_;
      puVar28 = puVar28 + 2;
      puVar29 = puVar29 + 2;
      puVar30 = puVar30 + 2;
      puVar33 = puVar33 + 2;
      pauVar23 = (undefined1 (*) [16])(*pauVar23 + local_88._16_8_ * local_48);
    }
    pauVar23 = (undefined1 (*) [16])(kernel->cstep * uVar27 * kernel->elemsize + (long)kernel->data)
    ;
    while (uVar21 = (uint)uVar22, (int)uVar21 < (int)uVar2) {
      if (iVar38 != 0) {
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             *(ulong *)((undefined1 *)local_88._0_8_ +
                       (ulong)((uVar21 & 1) + ((uint)(uVar22 >> 1) & 0x7fffffff)) *
                       local_88._16_8_ * local_48);
        vpmovsxbw_avx(auVar12);
        auVar1 = *pauVar23;
        auVar10 = pauVar23[1];
        auVar11 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        auVar12 = vpcmpgtb_avx((undefined1  [16])0x0,auVar10);
        vpunpcklbw_avx(auVar1,auVar11);
        vpunpckhbw_avx(auVar1,auVar11);
        vpunpcklbw_avx(auVar10,auVar12);
        vpunpckhbw_avx(auVar10,auVar12);
        halt_baddata();
      }
      auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar12 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar10 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar11 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar13 = vpunpcklqdq_avx(auVar1,auVar12);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar12);
      auVar1 = vpaddd_avx(auVar13,auVar1);
      auVar12 = vpunpcklqdq_avx(auVar10,auVar11);
      auVar10 = vpunpckhqdq_avx(auVar10,auVar11);
      auVar10 = vpaddd_avx(auVar10,auVar12);
      auVar1 = vpaddd_avx(auVar1,auVar10);
      *puVar28 = auVar1._0_4_;
      *puVar29 = auVar1._4_4_;
      *puVar30 = auVar1._8_4_;
      *puVar33 = auVar1._12_4_;
      puVar28 = puVar28 + 1;
      puVar29 = puVar29 + 1;
      puVar30 = puVar30 + 1;
      puVar33 = puVar33 + 1;
      uVar22 = (ulong)(uVar21 + 1);
    }
    uVar27 = uVar27 + 1;
  } while( true );
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}